

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

int __thiscall asmjit::Zone::dup(Zone *this,int __fd)

{
  uint8_t *__dest;
  byte in_CL;
  size_t in_RDX;
  undefined4 in_register_00000034;
  ulong size;
  
  __dest = (uint8_t *)0x0;
  if (((void *)CONCAT44(in_register_00000034,__fd) != (void *)0x0) && (in_RDX != 0)) {
    if (in_RDX == 0xffffffffffffffff) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
                 ,0xaa,"size != IntTraits<size_t>::maxValue()");
    }
    __dest = this->_ptr;
    size = in_CL + in_RDX;
    if ((ulong)((long)this->_end - (long)__dest) < size) {
      __dest = (uint8_t *)_alloc(this,size);
    }
    else {
      this->_ptr = __dest + size;
      if (this->_end < __dest + size) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                   ,0x9b,"_ptr <= _end");
      }
    }
    if (__dest == (uint8_t *)0x0) {
      __dest = (uint8_t *)0x0;
    }
    else {
      memcpy(__dest,(void *)CONCAT44(in_register_00000034,__fd),in_RDX);
      if (in_CL != 0) {
        __dest[in_RDX] = '\0';
      }
    }
  }
  return (int)__dest;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size)) return nullptr;

  ASMJIT_ASSERT(size != IntTraits<size_t>::maxValue());
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  ::memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}